

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_index.c
# Opt level: O0

int vmcache_index_remove(VMEMcache *cache,cache_entry *entry)

{
  critnib *c_00;
  void *pvVar1;
  int *piVar2;
  long lVar3;
  cache_entry *v;
  critnib *c;
  cache_entry *entry_local;
  VMEMcache *cache_local;
  
  c_00 = shard(cache->index,(entry->key).ksize,(char *)(entry + 1));
  util_rwlock_wrlock(&c_00->lock);
  pvVar1 = critnib_remove(c_00,entry);
  if (pvVar1 == (void *)0x0) {
    util_rwlock_unlock(&c_00->lock);
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache_index.c"
            ,200,"vmcache_index_remove",
            "vmcache_index_remove: cannot find an element with the given key in the index");
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    cache_local._4_4_ = -1;
  }
  else {
    c_00->leaf_count = c_00->leaf_count - 1;
    c_00->evict_count = c_00->evict_count + 1;
    lVar3 = malloc_usable_size(entry);
    c_00->DRAM_usage = c_00->DRAM_usage - lVar3;
    vmemcache_entry_release(cache,entry);
    util_rwlock_unlock(&c_00->lock);
    cache_local._4_4_ = 0;
  }
  return cache_local._4_4_;
}

Assistant:

int
vmcache_index_remove(VMEMcache *cache, struct cache_entry *entry)
{
	struct critnib *c = shard(cache->index, entry->key.ksize,
		entry->key.key);

	util_rwlock_wrlock(&c->lock);

	struct cache_entry *v = critnib_remove(c, entry);
	if (v == NULL) {
		util_rwlock_unlock(&c->lock);
		ERR(
			"vmcache_index_remove: cannot find an element with the given key in the index");
		errno = EINVAL;
		return -1;
	}

#ifdef STATS_ENABLED
	c->leaf_count--;
	c->evict_count++;
	c->DRAM_usage -= malloc_usable_size(entry);
#endif

	vmemcache_entry_release(cache, entry);

	util_rwlock_unlock(&c->lock);

	return 0;
}